

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQFailure<int,CfdNetworkType>
          (char *lhs_expression,char *rhs_expression,int *lhs,CfdNetworkType *rhs)

{
  char *in_RDX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  CfdNetworkType *in_RSI;
  internal *in_RDI;
  AssertionResult AVar1;
  internal *piVar2;
  string local_68;
  string local_48 [2];
  
  piVar2 = in_RDI;
  FormatForComparisonFailureMessage<int,CfdNetworkType>((int *)in_RSI,(CfdNetworkType *)in_RDI);
  FormatForComparisonFailureMessage<CfdNetworkType,int>(in_RSI,(int *)piVar2);
  EqFailure(in_RDI,(char *)in_RSI,in_RDX,local_48,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_48);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = piVar2;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}